

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>
::_find_key<std::basic_string_view<char,std::char_traits<char>>>
          (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>
           *this,basic_string_view<char,_std::char_traits<char>_> *key,size_t hashval)

{
  char *pcVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  __m128i match;
  undefined1 auVar8 [16];
  probe_seq<16UL> seq;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  undefined1 local_48 [16];
  
  if (*(long *)this != 0) {
    raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
    ::probe(&seq,(raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                  *)this,hashval);
    auVar7 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
    auVar7 = pshuflw(auVar7,auVar7,0);
    uVar6 = auVar7._0_4_;
    local_48._4_4_ = uVar6;
    local_48._0_4_ = uVar6;
    local_48._8_4_ = uVar6;
    local_48._12_4_ = uVar6;
    while( true ) {
      pcVar1 = (char *)(*(long *)this + seq.offset_);
      local_58 = *pcVar1;
      cStack_57 = pcVar1[1];
      cStack_56 = pcVar1[2];
      cStack_55 = pcVar1[3];
      cStack_54 = pcVar1[4];
      cStack_53 = pcVar1[5];
      cStack_52 = pcVar1[6];
      cStack_51 = pcVar1[7];
      cStack_50 = pcVar1[8];
      cStack_4f = pcVar1[9];
      cStack_4e = pcVar1[10];
      cStack_4d = pcVar1[0xb];
      cStack_4c = pcVar1[0xc];
      cStack_4b = pcVar1[0xd];
      cStack_4a = pcVar1[0xe];
      cStack_49 = pcVar1[0xf];
      auVar7[0] = -(local_48[0] == local_58);
      auVar7[1] = -(local_48[1] == cStack_57);
      auVar7[2] = -(local_48[2] == cStack_56);
      auVar7[3] = -(local_48[3] == cStack_55);
      auVar7[4] = -(local_48[4] == cStack_54);
      auVar7[5] = -(local_48[5] == cStack_53);
      auVar7[6] = -(local_48[6] == cStack_52);
      auVar7[7] = -(local_48[7] == cStack_51);
      auVar7[8] = -(local_48[8] == cStack_50);
      auVar7[9] = -(local_48[9] == cStack_4f);
      auVar7[10] = -(local_48[10] == cStack_4e);
      auVar7[0xb] = -(local_48[0xb] == cStack_4d);
      auVar7[0xc] = -(local_48[0xc] == cStack_4c);
      auVar7[0xd] = -(local_48[0xd] == cStack_4b);
      auVar7[0xe] = -(local_48[0xe] == cStack_4a);
      auVar7[0xf] = -(local_48[0xf] == cStack_49);
      for (uVar4 = (uint)(ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(auVar7[0xf] >> 7) << 0xf); uVar4 != 0;
          uVar4 = uVar4 - 1 & uVar4) {
        uVar2 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        lVar5 = (seq.offset_ + uVar2 & seq.mask_) * 0x40;
        local_68._M_str = *(char **)(*(long *)(this + 8) + lVar5);
        local_68._M_len = *(size_t *)(*(long *)(this + 8) + 8 + lVar5);
        bVar3 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           (this + 0x28),&local_68,key);
        if (bVar3) {
          return uVar2 + seq.offset_ & seq.mask_;
        }
      }
      auVar8[0] = -(local_58 == -0x80);
      auVar8[1] = -(cStack_57 == -0x80);
      auVar8[2] = -(cStack_56 == -0x80);
      auVar8[3] = -(cStack_55 == -0x80);
      auVar8[4] = -(cStack_54 == -0x80);
      auVar8[5] = -(cStack_53 == -0x80);
      auVar8[6] = -(cStack_52 == -0x80);
      auVar8[7] = -(cStack_51 == -0x80);
      auVar8[8] = -(cStack_50 == -0x80);
      auVar8[9] = -(cStack_4f == -0x80);
      auVar8[10] = -(cStack_4e == -0x80);
      auVar8[0xb] = -(cStack_4d == -0x80);
      auVar8[0xc] = -(cStack_4c == -0x80);
      auVar8[0xd] = -(cStack_4b == -0x80);
      auVar8[0xe] = -(cStack_4a == -0x80);
      auVar8[0xf] = -(cStack_49 == -0x80);
      if ((((((((((((((((auVar8 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar8 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar8 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar8 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar8 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar8 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar8 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar8 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar8 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar8 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar8 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar8 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cStack_49 == -0x80)
      break;
      seq.index_ = seq.index_ + 0x10;
      seq.offset_ = seq.index_ + seq.offset_ & seq.mask_;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t _find_key(const K& PHMAP_RESTRICT key, size_t hashval) {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return (size_t)-1;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                                          EqualElement<K>{key, eq_ref()},
                                          PolicyTraits::element(slots_ + seq.offset((size_t)i)))))
                    return seq.offset((size_t)i);
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) break;
            seq.next();
        }
        return (size_t)-1;
    }